

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.h
# Opt level: O2

EntryNode * __thiscall GraphBuilder::addNode<EntryNode>(GraphBuilder *this,EntryNode *node)

{
  bool bVar1;
  __ireturn_type _Var2;
  pair<std::__detail::_Node_iterator<std::pair<const_llvm::Instruction_*const,_Node_*>,_false,_false>,_bool>
  pVar3;
  EntryNode *local_20;
  EntryNode *local_18;
  
  local_20 = node;
  bVar1 = Node::isArtificial(&node->super_Node);
  if (bVar1) {
    local_18 = node;
    _Var2 = std::__detail::
            _Insert<Node_*,_Node_*,_std::allocator<Node_*>,_std::__detail::_Identity,_std::equal_to<Node_*>,_std::hash<Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
            ::insert((_Insert<Node_*,_Node_*,_std::allocator<Node_*>,_std::__detail::_Identity,_std::equal_to<Node_*>,_std::hash<Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                      *)&this->artificialNodes_,(value_type *)&local_18);
    local_20 = (EntryNode *)0x0;
    if (((undefined1  [16])_Var2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      local_20 = node;
    }
  }
  else {
    local_18 = (EntryNode *)Node::llvmInstruction(&node->super_Node);
    pVar3 = std::
            _Hashtable<llvm::Instruction_const*,std::pair<llvm::Instruction_const*const,Node*>,std::allocator<std::pair<llvm::Instruction_const*const,Node*>>,std::__detail::_Select1st,std::equal_to<llvm::Instruction_const*>,std::hash<llvm::Instruction_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<llvm::Instruction_const*,EntryNode*&>
                      ((_Hashtable<llvm::Instruction_const*,std::pair<llvm::Instruction_const*const,Node*>,std::allocator<std::pair<llvm::Instruction_const*const,Node*>>,std::__detail::_Select1st,std::equal_to<llvm::Instruction_const*>,std::hash<llvm::Instruction_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&this->llvmToNodeMap_,&local_18,&local_20);
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      local_20 = (EntryNode *)0x0;
    }
  }
  return local_20;
}

Assistant:

T *addNode(T *node) {
        if (node->isArtificial()) {
            if (this->artificialNodes_.insert(node).second) {
                return node;
            }
        } else {
            if (this->llvmToNodeMap_.emplace(node->llvmInstruction(), node)
                        .second) {
                return node;
            }
        }
        return nullptr;
    }